

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPresentationStyle::~IfcPresentationStyle(IfcPresentationStyle *this)

{
  void *pvVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
           _vptr_ObjectHelper[-3];
  pvVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
            field_0x20 + (long)p_Var2;
  *(undefined ***)((long)pvVar1 + -0x20) = &PTR__IfcPresentationStyle_00828df8;
  *(undefined ***)((long)pvVar1 + 0x18) = &PTR__IfcPresentationStyle_00828e20;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  operator_delete((_func_int *)
                  ((long)&(this->
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
                          _vptr_ObjectHelper + (long)p_Var2));
  return;
}

Assistant:

IfcPresentationStyle() : Object("IfcPresentationStyle") {}